

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<TraceEnum::EnumValue>::Inserter::setup
          (Inserter *this,qsizetype pos,qsizetype n)

{
  long lVar1;
  qsizetype dist;
  qsizetype n_local;
  qsizetype pos_local;
  Inserter *this_local;
  
  this->end = this->begin + this->size;
  this->last = this->end + -1;
  this->where = this->begin + pos;
  lVar1 = this->size - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = n;
  this->move = n - lVar1;
  this->sourceCopyAssign = n;
  if (lVar1 < n) {
    this->sourceCopyConstruct = n - lVar1;
    this->move = 0;
    this->sourceCopyAssign = this->sourceCopyAssign - this->sourceCopyConstruct;
  }
  return;
}

Assistant:

void setup(qsizetype pos, qsizetype n)
        {
            end = begin + size;
            last = end - 1;
            where = begin + pos;
            qsizetype dist = size - pos;
            sourceCopyConstruct = 0;
            nSource = n;
            move = n - dist; // smaller 0
            sourceCopyAssign = n;
            if (n > dist) {
                sourceCopyConstruct = n - dist;
                move = 0;
                sourceCopyAssign -= sourceCopyConstruct;
            }
        }